

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::lerp
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  long *plVar10;
  _func_int **pp_Var11;
  long *in_RDX;
  long *plVar12;
  float fVar13;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar12 = (long *)0x0;
  }
  else {
    plVar10 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
    plVar12 = (long *)0x0;
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 0x10))(plVar10);
      bVar1 = false;
      plVar12 = plVar10;
    }
  }
  pp_Var11 = (_func_int **)alignedMalloc(0x90,0x10);
  fVar13 = 1.0 - f;
  fVar2 = *(float *)(plVar12 + 0x10);
  fVar3 = *(float *)((long)plVar12 + 0x84);
  fVar4 = *(float *)(plVar12 + 0x11);
  fVar5 = *(float *)((long)plVar12 + 0x8c);
  fVar6 = *(float *)&light1_in[0x10].ptr;
  fVar7 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar8 = *(float *)&light1_in[0x11].ptr;
  fVar9 = *(float *)((long)&light1_in[0x11].ptr + 4);
  pp_Var11[1] = (_func_int *)0x0;
  pp_Var11[2] = (_func_int *)(pp_Var11 + 4);
  pp_Var11[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var11 + 4) = 0;
  pp_Var11[6] = (_func_int *)(pp_Var11 + 8);
  pp_Var11[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var11 + 8) = 0;
  pp_Var11[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var11 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var11 + 0x5c) = 0xffffffff;
  pp_Var11[0xc] = (_func_int *)0x0;
  *pp_Var11 = (_func_int *)&PTR__Node_002c6808;
  *(undefined4 *)(pp_Var11 + 0xe) = 0;
  *(float *)(pp_Var11 + 0x10) = fVar13 * fVar6 + f * fVar2;
  *(float *)((long)pp_Var11 + 0x84) = fVar13 * fVar7 + f * fVar3;
  *(float *)(pp_Var11 + 0x11) = fVar13 * fVar8 + f * fVar4;
  *(float *)((long)pp_Var11 + 0x8c) = fVar13 * fVar9 + f * fVar5;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var11;
  LOCK();
  pp_Var11[1] = pp_Var11[1] + 1;
  UNLOCK();
  if (!bVar1) {
    (**(code **)(*plVar12 + 0x18))(plVar12);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }